

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O1

VP8StatusCode WebPFlipBuffer(WebPDecBuffer *buffer)

{
  uint8_t **ppuVar1;
  int iVar2;
  uint8_t *puVar3;
  long lVar4;
  
  if (buffer == (WebPDecBuffer *)0x0) {
    return VP8_STATUS_INVALID_PARAM;
  }
  puVar3 = (buffer->u).RGBA.rgba;
  if (MODE_rgbA_4444 < buffer->colorspace) {
    lVar4 = (long)buffer->height + -1;
    iVar2 = (buffer->u).YUVA.y_stride;
    (buffer->u).RGBA.rgba = puVar3 + iVar2 * lVar4;
    (buffer->u).YUVA.y_stride = -iVar2;
    iVar2 = (buffer->u).YUVA.u_stride;
    ppuVar1 = &(buffer->u).YUVA.u;
    *ppuVar1 = *ppuVar1 + (long)iVar2 * (lVar4 >> 1);
    (buffer->u).YUVA.u_stride = -iVar2;
    iVar2 = (buffer->u).YUVA.v_stride;
    ppuVar1 = &(buffer->u).YUVA.v;
    *ppuVar1 = *ppuVar1 + (lVar4 >> 1) * (long)iVar2;
    (buffer->u).YUVA.v_stride = -iVar2;
    puVar3 = (buffer->u).YUVA.a;
    if (puVar3 != (uint8_t *)0x0) {
      iVar2 = (buffer->u).YUVA.a_stride;
      (buffer->u).YUVA.a = puVar3 + lVar4 * iVar2;
      (buffer->u).YUVA.a_stride = -iVar2;
    }
    return VP8_STATUS_OK;
  }
  iVar2 = (buffer->u).RGBA.stride;
  (buffer->u).RGBA.rgba = puVar3 + ((long)buffer->height + -1) * (long)iVar2;
  (buffer->u).RGBA.stride = -iVar2;
  return VP8_STATUS_OK;
}

Assistant:

VP8StatusCode WebPFlipBuffer(WebPDecBuffer* const buffer) {
  if (buffer == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (WebPIsRGBMode(buffer->colorspace)) {
    WebPRGBABuffer* const buf = &buffer->u.RGBA;
    buf->rgba += (int64_t)(buffer->height - 1) * buf->stride;
    buf->stride = -buf->stride;
  } else {
    WebPYUVABuffer* const buf = &buffer->u.YUVA;
    const int64_t H = buffer->height;
    buf->y += (H - 1) * buf->y_stride;
    buf->y_stride = -buf->y_stride;
    buf->u += ((H - 1) >> 1) * buf->u_stride;
    buf->u_stride = -buf->u_stride;
    buf->v += ((H - 1) >> 1) * buf->v_stride;
    buf->v_stride = -buf->v_stride;
    if (buf->a != NULL) {
      buf->a += (H - 1) * buf->a_stride;
      buf->a_stride = -buf->a_stride;
    }
  }
  return VP8_STATUS_OK;
}